

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar12;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  float n2;
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  undefined1 auVar15 [16];
  undefined1 auVar18 [64];
  undefined1 auVar21 [56];
  undefined1 auVar19 [64];
  float fVar22;
  undefined1 auVar23 [16];
  Bounds2f BVar24;
  Vector3f VVar25;
  Point3f PVar26;
  int local_40;
  float va;
  undefined1 local_38 [16];
  undefined1 auVar10 [64];
  undefined1 auVar17 [64];
  undefined1 auVar20 [60];
  
  auVar20 = (undefined1  [60])0x0;
  auVar13 = ZEXT856(0);
  VVar25 = AnimatedTransform::operator()
                     ((AnimatedTransform *)this,(Vector3f)(ZEXT412(0x3f800000) << 0x40),ray->time);
  auVar16._0_4_ = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._4_60_ = auVar20;
  auVar18._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar13;
  auVar7 = vmovshdup_avx(auVar18._0_16_);
  auVar15 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ *
                                         (ray->d).super_Tuple3<pbrt::Vector3,_float>.y)),auVar15,
                           auVar18._0_16_);
  auVar7 = vfmadd231ss_fma(auVar7,auVar16._0_16_,
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar22 = auVar7._0_4_;
  if (this->cosTotalWidth < fVar22) {
    auVar7._0_12_ = ZEXT812(0);
    auVar7._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar7,ZEXT416((uint)(this->super_ProjectiveCamera).lensRadius),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar5 = (float)((uint)bVar4 * (int)(this->super_ProjectiveCamera).focalDistance +
                   (uint)!bVar4 * 0x3f800000) / fVar22;
    auVar7 = vinsertps_avx(auVar15,ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y),0x10
                          );
    uVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
    uVar2 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
    fVar6 = auVar7._0_4_ * fVar5 + (float)uVar1;
    fVar12 = auVar7._4_4_ * fVar5 + (float)uVar2;
    PVar26.super_Tuple3<pbrt::Point3,_float>.z =
         fVar5 * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
         (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
    PVar26.super_Tuple3<pbrt::Point3,_float>.x = fVar6;
    PVar26.super_Tuple3<pbrt::Point3,_float>.y = fVar12;
    auVar20 = (undefined1  [60])0x0;
    auVar13 = ZEXT856(SUB168(CONCAT412(auVar7._12_4_ * fVar5 + 0.0,
                                       CONCAT48(auVar7._8_4_ * fVar5 + 0.0,CONCAT44(fVar12,fVar6))),
                             8));
    PVar26 = AnimatedTransform::ApplyInverse((AnimatedTransform *)this,PVar26,ray->time);
    auVar17._0_4_ = PVar26.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._4_60_ = auVar20;
    auVar10._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar13;
    auVar7 = vmovshdup_avx(auVar10._0_16_);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ *
                                           (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [1])),auVar10._0_16_,
                             ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [0]));
    auVar15 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][2]),auVar17._0_16_,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][3]));
    va = auVar8._0_4_ + auVar15._0_4_;
    local_40 = 0;
    if ((va == 0.0) && (!NAN(va))) {
      LogFatal<char_const(&)[3],char_const(&)[2],char_const(&)[3],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform.h"
                 ,0x18d,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [3])"wp",
                 (char (*) [2])0x287c073,(char (*) [3])"wp",&va,(char (*) [2])0x287c073,&local_40);
    }
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])
                             ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 1),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                          [1]),0x10);
    auVar23._0_4_ = auVar7._0_4_ * auVar15._0_4_;
    auVar23._4_4_ = auVar7._4_4_ * auVar15._4_4_;
    auVar23._8_4_ = auVar7._8_4_ * auVar15._8_4_;
    auVar23._12_4_ = auVar7._12_4_ * auVar15._12_4_;
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])
                            ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 2),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [2]),0x10);
    auVar14._4_4_ = auVar17._0_4_;
    auVar14._0_4_ = auVar17._0_4_;
    auVar14._8_4_ = auVar17._0_4_;
    auVar14._12_4_ = auVar17._0_4_;
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])
                             ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 3),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                          [3]),0x10);
    auVar15 = vfmadd231ps_fma(auVar15,auVar7,auVar14);
    auVar7 = vinsertps_avx((undefined1  [16])
                           (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0],
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [0]),0x10);
    auVar8._0_4_ = PVar26.super_Tuple3<pbrt::Point3,_float>.x;
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    auVar7 = vfmadd213ps_fma(auVar8,auVar7,auVar23);
    auVar9._0_4_ = auVar7._0_4_ + auVar15._0_4_;
    auVar9._4_4_ = auVar7._4_4_ + auVar15._4_4_;
    auVar9._8_4_ = auVar7._8_4_ + auVar15._8_4_;
    auVar9._12_4_ = auVar7._12_4_ + auVar15._12_4_;
    auVar13 = ZEXT856(auVar9._8_8_);
    auVar15._4_4_ = va;
    auVar15._0_4_ = va;
    auVar15._8_4_ = va;
    auVar15._12_4_ = va;
    auVar7 = vdivps_avx(auVar9,auVar15);
    auVar18 = ZEXT1664(auVar7);
    if ((va == 1.0) && (!NAN(va))) {
      auVar18 = ZEXT1664(auVar9);
    }
    auVar21 = auVar18._8_56_;
    local_38 = auVar18._0_16_;
    BVar24 = FilmBase::SampleBounds
                       ((FilmBase *)
                        ((this->super_ProjectiveCamera).super_CameraBase.film.
                         super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff
                        ));
    auVar19._0_8_ = BVar24.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar19._8_56_ = auVar21;
    auVar11._0_8_ = BVar24.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar11._8_56_ = auVar13;
    auVar7 = vmovlhps_avx(local_38,auVar11._0_16_);
    auVar15 = vmovlhps_avx(auVar19._0_16_,local_38);
    uVar3 = vcmpps_avx512vl(auVar7,auVar15,2);
    if ((char)uVar3 == '\x0f') {
      fVar5 = (this->super_ProjectiveCamera).lensRadius;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),ZEXT816(0) << 0x20,4);
      bVar4 = (bool)((byte)uVar3 & 1);
      *pdfPos = (Float)((uint)bVar4 * (int)(1.0 / (fVar5 * fVar5 * 3.1415927)) +
                       (uint)!bVar4 * 0x3f800000);
      *pdfDir = 1.0 / (fVar22 * fVar22 * fVar22 * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}